

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<char>::ReallocForNuma(TPZVec<char> *this)

{
  void *__dest;
  long in_RDI;
  char *newStore;
  
  if ((*(long *)(in_RDI + 0x10) != 0) && (*(long *)(in_RDI + 8) != 0)) {
    __dest = operator_new__(*(ulong *)(in_RDI + 0x10));
    memcpy(__dest,*(void **)(in_RDI + 8),*(size_t *)(in_RDI + 0x10));
    if (*(void **)(in_RDI + 8) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 8));
    }
    *(void **)(in_RDI + 8) = __dest;
  }
  return;
}

Assistant:

void ReallocForNuma() {
        if (fNElements == 0 || fStore == NULL)
            return;
        T* newStore = new T[fNElements];
        memcpy((void*)newStore,(void*)fStore,fNElements*sizeof(T));
        delete [] fStore;
        fStore = newStore;
	}